

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
math::wide_integer::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *out,
          uintwide_t<24U,_unsigned_char,_void,_false> *x)

{
  value_type *this;
  char fill_char_str;
  fmtflags __a;
  _Ios_Fmtflags _Var1;
  unsigned_fast_type field_width_00;
  iterator str_result_00;
  pointer pcVar2;
  iterator str_result_01;
  pointer pcVar3;
  iterator str_result_02;
  pointer pcVar4;
  ostream *poVar5;
  bool show_pos_00;
  bool show_base_00;
  bool is_uppercase_00;
  string local_240 [39];
  value_type local_219;
  undefined1 auStack_218 [8];
  string_storage_hex_type str_result_2;
  undefined1 local_1f8 [8];
  string_storage_dec_type str_result_1;
  string_storage_oct_type str_result;
  char fill_char_out;
  unsigned_fast_type field_width;
  uint_fast8_t base_rep;
  bool is_uppercase;
  bool show_base;
  bool show_pos;
  fmtflags my_flags;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> ostr;
  uintwide_t<24U,_unsigned_char,_void,_false> *x_local;
  basic_ostream<char,_std::char_traits<char>_> *out_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&base_rep);
  __a = std::ios_base::flags((ios_base *)(out + *(long *)(*(long *)out + -0x18)));
  _Var1 = std::operator&(__a,_S_showpos);
  show_pos_00 = _Var1 == _S_showpos;
  _Var1 = std::operator&(__a,_S_showbase);
  show_base_00 = _Var1 == _S_showbase;
  _Var1 = std::operator&(__a,_S_uppercase);
  is_uppercase_00 = _Var1 == _S_uppercase;
  _Var1 = std::operator&(__a,_S_oct);
  if (_Var1 == _S_oct) {
    field_width._0_1_ = '\b';
  }
  else {
    _Var1 = std::operator&(__a,_S_hex);
    if (_Var1 == _S_hex) {
      field_width._0_1_ = '\x10';
    }
    else {
      field_width._0_1_ = '\n';
    }
  }
  field_width_00 = std::ios_base::width((ios_base *)(out + *(long *)(*(long *)out + -0x18)));
  fill_char_str = std::ios::fill();
  if ((char)field_width == '\b') {
    stack0xfffffffffffffe28 = 0;
    this = str_result_1.super_array<char,_29UL>.elems + 0x18;
    detail::fixed_static_array<char,_30U>::fixed_static_array((fixed_static_array<char,_30U> *)this)
    ;
    str_result_1.super_array<char,_29UL>.elems[0x17] = '\0';
    detail::array_detail::array<char,_30UL>::fill
              ((array<char,_30UL> *)this,str_result_1.super_array<char,_29UL>.elems + 0x17);
    str_result_00 =
         detail::array_detail::array<char,_30UL>::begin
                   ((array<char,_30UL> *)(str_result_1.super_array<char,_29UL>.elems + 0x18));
    uintwide_t<64u,unsigned_short,void,false>::wr_string<char*>
              ((uintwide_t<64u,unsigned_short,void,false> *)x,str_result_00,'\b',show_base_00,
               show_pos_00,is_uppercase_00,field_width_00,fill_char_str);
    pcVar2 = detail::array_detail::array<char,_30UL>::data
                       ((array<char,_30UL> *)(str_result_1.super_array<char,_29UL>.elems + 0x18));
    std::operator<<((ostream *)&base_rep,pcVar2);
  }
  else if ((char)field_width == '\n') {
    str_result_1.super_array<char,_29UL>.elems[8] = '\0';
    str_result_1.super_array<char,_29UL>.elems[9] = '\0';
    str_result_1.super_array<char,_29UL>.elems[10] = '\0';
    str_result_1.super_array<char,_29UL>.elems[0xb] = '\0';
    str_result_1.super_array<char,_29UL>.elems[0xc] = '\0';
    str_result_1.super_array<char,_29UL>.elems[0xd] = '\0';
    str_result_1.super_array<char,_29UL>.elems[0xe] = '\0';
    str_result_1.super_array<char,_29UL>.elems[0xf] = '\0';
    str_result_1.super_array<char,_29UL>.elems[0x10] = '\0';
    str_result_1.super_array<char,_29UL>.elems[0x11] = '\0';
    str_result_1.super_array<char,_29UL>.elems[0x12] = '\0';
    str_result_1.super_array<char,_29UL>.elems[0x13] = '\0';
    str_result_1.super_array<char,_29UL>.elems[0x14] = '\0';
    local_1f8[0] = '\0';
    local_1f8[1] = '\0';
    local_1f8[2] = '\0';
    local_1f8[3] = '\0';
    local_1f8[4] = '\0';
    local_1f8[5] = '\0';
    local_1f8[6] = '\0';
    local_1f8[7] = '\0';
    str_result_1.super_array<char,_29UL>.elems[0] = '\0';
    str_result_1.super_array<char,_29UL>.elems[1] = '\0';
    str_result_1.super_array<char,_29UL>.elems[2] = '\0';
    str_result_1.super_array<char,_29UL>.elems[3] = '\0';
    str_result_1.super_array<char,_29UL>.elems[4] = '\0';
    str_result_1.super_array<char,_29UL>.elems[5] = '\0';
    str_result_1.super_array<char,_29UL>.elems[6] = '\0';
    str_result_1.super_array<char,_29UL>.elems[7] = '\0';
    detail::fixed_static_array<char,_29U>::fixed_static_array
              ((fixed_static_array<char,_29U> *)local_1f8);
    str_result_2.super_array<char,_24UL>.elems[0x17] = '\0';
    detail::array_detail::array<char,_29UL>::fill
              ((array<char,_29UL> *)local_1f8,str_result_2.super_array<char,_24UL>.elems + 0x17);
    str_result_01 = detail::array_detail::array<char,_29UL>::begin((array<char,_29UL> *)local_1f8);
    uintwide_t<64u,unsigned_short,void,false>::wr_string<char*>
              ((uintwide_t<64u,unsigned_short,void,false> *)x,str_result_01,'\n',show_base_00,
               show_pos_00,is_uppercase_00,field_width_00,fill_char_str);
    pcVar3 = detail::array_detail::array<char,_29UL>::data((array<char,_29UL> *)local_1f8);
    std::operator<<((ostream *)&base_rep,pcVar3);
  }
  else if ((char)field_width == '\x10') {
    auStack_218[0] = '\0';
    auStack_218[1] = '\0';
    auStack_218[2] = '\0';
    auStack_218[3] = '\0';
    auStack_218[4] = '\0';
    auStack_218[5] = '\0';
    auStack_218[6] = '\0';
    auStack_218[7] = '\0';
    str_result_2.super_array<char,_24UL>.elems[0] = '\0';
    str_result_2.super_array<char,_24UL>.elems[1] = '\0';
    str_result_2.super_array<char,_24UL>.elems[2] = '\0';
    str_result_2.super_array<char,_24UL>.elems[3] = '\0';
    str_result_2.super_array<char,_24UL>.elems[4] = '\0';
    str_result_2.super_array<char,_24UL>.elems[5] = '\0';
    str_result_2.super_array<char,_24UL>.elems[6] = '\0';
    str_result_2.super_array<char,_24UL>.elems[7] = '\0';
    str_result_2.super_array<char,_24UL>.elems[8] = '\0';
    str_result_2.super_array<char,_24UL>.elems[9] = '\0';
    str_result_2.super_array<char,_24UL>.elems[10] = '\0';
    str_result_2.super_array<char,_24UL>.elems[0xb] = '\0';
    str_result_2.super_array<char,_24UL>.elems[0xc] = '\0';
    str_result_2.super_array<char,_24UL>.elems[0xd] = '\0';
    str_result_2.super_array<char,_24UL>.elems[0xe] = '\0';
    str_result_2.super_array<char,_24UL>.elems[0xf] = '\0';
    detail::fixed_static_array<char,_24U>::fixed_static_array
              ((fixed_static_array<char,_24U> *)auStack_218);
    local_219 = '\0';
    detail::array_detail::array<char,_24UL>::fill((array<char,_24UL> *)auStack_218,&local_219);
    str_result_02 = detail::array_detail::array<char,_24UL>::begin((array<char,_24UL> *)auStack_218)
    ;
    uintwide_t<64u,unsigned_short,void,false>::wr_string<char*>
              ((uintwide_t<64u,unsigned_short,void,false> *)x,str_result_02,'\x10',show_base_00,
               show_pos_00,is_uppercase_00,field_width_00,fill_char_str);
    pcVar4 = detail::array_detail::array<char,_24UL>::data((array<char,_24UL> *)auStack_218);
    std::operator<<((ostream *)&base_rep,pcVar4);
  }
  std::__cxx11::ostringstream::str();
  poVar5 = std::operator<<(out,local_240);
  std::__cxx11::string::~string(local_240);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&base_rep);
  return poVar5;
}

Assistant:

auto operator<<(std::basic_ostream<char_type, traits_type>& out,
                  const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& x) -> std::basic_ostream<char_type, traits_type>&
  {
    std::basic_ostringstream<char_type, traits_type> ostr;

    const std::ios::fmtflags my_flags = out.flags();

    const auto show_pos     = ((my_flags & std::ios::showpos)   == std::ios::showpos);
    const auto show_base    = ((my_flags & std::ios::showbase)  == std::ios::showbase);
    const auto is_uppercase = ((my_flags & std::ios::uppercase) == std::ios::uppercase);

    auto base_rep = std::uint_fast8_t { };

    if     ((my_flags & std::ios::oct) == std::ios::oct) { base_rep = static_cast<std::uint_fast8_t>(UINT8_C( 8)); }
    else if((my_flags & std::ios::hex) == std::ios::hex) { base_rep = static_cast<std::uint_fast8_t>(UINT8_C(16)); }
    else                                                 { base_rep = static_cast<std::uint_fast8_t>(UINT8_C(10)); }

    const auto field_width   = static_cast<unsigned_fast_type>(out.width());
    const auto fill_char_out = static_cast<char>(out.fill());

    using local_wide_integer_type = uintwide_t<Width2, LimbType, AllocatorType, IsSigned>;

    if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
    {
      using string_storage_oct_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_oct()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_oct(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                         std::allocator<void>,
                                                                                         AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_oct_type str_result { }; // LCOV_EXCL_LINE

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }
    else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
    {
      using string_storage_dec_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_dec()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_dec(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                          std::allocator<void>,
                                                                                          AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_dec_type str_result { };

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }
    else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
    {
      using string_storage_hex_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_hex()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_hex(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                         std::allocator<void>,
                                                                                         AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_hex_type str_result { };

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }

    return (out << ostr.str());
  }